

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

void __thiscall tf::Executor::_schedule(Executor *this,Node *node)

{
  size_type sVar1;
  vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
  *this_00;
  ulong __n;
  scoped_lock<std::mutex> *in_RSI;
  mutex_type *in_RDI;
  Node *unaff_retaddr;
  UnboundedTaskQueue<tf::Node_*> *in_stack_00000008;
  scoped_lock<std::mutex> lock;
  unsigned_long b;
  
  this_00 = (vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
             *)(&in_RDI[5].super___mutex_base._M_mutex.__align + 2);
  sVar1 = std::
          vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
          ::size(this_00);
  __n = (ulong)in_RSI % sVar1;
  std::vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>::
  operator[](this_00,__n);
  std::scoped_lock<std::mutex>::scoped_lock(in_RSI,in_RDI);
  std::vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>::
  operator[](this_00,__n);
  UnboundedTaskQueue<tf::Node_*>::push(in_stack_00000008,unaff_retaddr);
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x135802);
  NonblockingNotifierV2::notify_one((NonblockingNotifierV2 *)0x13580f);
  return;
}

Assistant:

inline void Executor::_schedule(Node* node) {
  _buffers.push(node);
  _notifier.notify_one();
}